

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::CenturyFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  scalar_function_t local_48;
  code *local_28;
  undefined8 local_20;
  code *local_18;
  code *local_10;
  
  local_20 = 0;
  local_28 = DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::CenturyOperator>;
  local_10 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::CenturyOperator>;
  local_48._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,(duckdb *)&local_28,&local_48,(scalar_function_t *)&stack0xffffffffffffff98,
             (scalar_function_t *)DatePart::CenturyOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::CenturyOperator::PropagateStatistics<duckdb::timestamp_t>,
             ScalarFunction::
             UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::CenturyOperator>);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff98,(_Any_data *)&stack0xffffffffffffff98,
               __destroy_functor);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet CenturyFun::GetFunctions() {
	return GetDatePartFunction<DatePart::CenturyOperator>();
}